

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_key.cpp
# Opt level: O0

void __thiscall
cfdcapi_key_EcdsaAdaptorTest_Test::~cfdcapi_key_EcdsaAdaptorTest_Test
          (cfdcapi_key_EcdsaAdaptorTest_Test *this)

{
  void *in_RDI;
  
  ~cfdcapi_key_EcdsaAdaptorTest_Test((cfdcapi_key_EcdsaAdaptorTest_Test *)0x378378);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(cfdcapi_key, EcdsaAdaptorTest) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  const char* msg =
      "024bdd11f2144e825db05759bdd9041367a420fad14b665fd08af5b42056e5e2";
  const char* adaptor =
      "038d48057fc4ce150482114d43201b333bf3706f3cd527e8767ceb4b443ab5d349";
  const char* sk =
      "90ac0d5dc0a1a9ab352afb02005a5cc6c4df0da61d8149d729ff50db9b5a5215";
  const char* pubkey =
      "03490cec9a53cd8f2f664aea61922f26ee920c42d2489778bb7c9d9ece44d149a7";
  const char* adaptor_sig_str =
      "00cbe0859638c3600ea1872ed7a55b8182a251969f59d7d2da6bd4afedf25f5021a49956"
      "234cbbbbede8ca72e0113319c84921bf1224897a6abd89dc96b9c5b208";
  const char* adaptor_proof_str =
      "00b02472be1ba09f5675488e841a10878b38c798ca63eff3650c8e311e3e2ebe2e3b6fee"
      "5654580a91cc5149a71bf25bcbeae63dea3ac5ad157a0ab7373c3011d0fc2592a07f719c"
      "5fc1323f935569ecd010db62f045e965cc1d564eb42cce8d6d";

  const char* adaptor_sig2 =
      "01099c91aa1fe7f25c41085c1d3c9e73fe04a9d24dac3f9c2172d6198628e57f47bb90"
      "e2ad6630900b69f55674c8ad74a419e6ce113c10a21a79345a6e47bc74c1";
  const ByteData sig_der(
      "30440220099c91aa1fe7f25c41085c1d3c9e73fe04a9d24dac3f9c2172d6198628e57f47"
      "02204d13456e98d8989043fd4674302ce90c432e2f8bb0269f02c72aafec60b72de101");
  const char* secret =
      "475697a71a74ff3f2a8f150534e9b67d4b0b6561fab86fcaa51f8c9d6c9db8c6";

  char* adaptor_signature = NULL;
  char* adaptor_proof = NULL;
  ret = CfdSignEcdsaAdaptor(handle, msg, sk, adaptor,
      &adaptor_signature, &adaptor_proof);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ(adaptor_sig_str, adaptor_signature);
    EXPECT_STREQ(adaptor_proof_str, adaptor_proof);
    CfdFreeStringBuffer(adaptor_signature);
    CfdFreeStringBuffer(adaptor_proof);
  }

  ret = CfdVerifyEcdsaAdaptor(
      handle, adaptor_sig_str, adaptor_proof_str, adaptor, msg, pubkey);
  EXPECT_EQ(kCfdSuccess, ret);

  SigHashType sig_hash;
  auto raw_sig = CryptoUtil::ConvertSignatureFromDer(sig_der, &sig_hash);
  char* signature = NULL;
  ret = CfdAdaptEcdsaAdaptor(handle, adaptor_sig2, secret, &signature);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ(raw_sig.GetHex().c_str(), signature);
    CfdFreeStringBuffer(signature);
  }

  char* adaptor_secret = NULL;
  ret = CfdExtractEcdsaAdaptorSecret(
      handle, adaptor_sig2, raw_sig.GetHex().c_str(), adaptor, &adaptor_secret);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ(secret, adaptor_secret);
    CfdFreeStringBuffer(adaptor_secret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}